

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O1

int pcp_socket_create_impl(int domain,int type,int protocol)

{
  ushort uVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  socklen_t sVar4;
  char *pcVar5;
  int optval;
  uint32_t flg;
  sockaddr_storage sas;
  undefined4 local_b0;
  uint local_ac;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_a8.sa_data[6] = '\0';
  local_a8.sa_data[7] = '\0';
  local_a8.sa_data[8] = '\0';
  local_a8.sa_data[9] = '\0';
  local_a8.sa_data[10] = '\0';
  local_a8.sa_data[0xb] = '\0';
  local_a8.sa_data[0xc] = '\0';
  local_a8.sa_data[0xd] = '\0';
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.sa_data._0_6_ = 0;
  local_a8.sa_family = (ushort)domain;
  if ((domain == 10) || (domain == 2)) {
    local_a8.sa_data._0_2_ = 0xe614;
    local_a8.sa_data._2_4_ = 0;
  }
  else {
    pcp_logger(PCP_LOGLVL_ERR,"Unsupported socket domain:%d",(ulong)(uint)domain);
  }
  __fd = socket(domain,type,protocol);
  if (__fd != -1) {
    local_ac = fcntl(__fd,3,0);
    iVar2 = fcntl(__fd,4,(ulong)(local_ac | 0x800));
    if (iVar2 == 0) {
      local_ac = 0;
      iVar2 = setsockopt(__fd,0x29,0x1a,&local_ac,4);
      if (iVar2 == -1) {
        pcVar5 = 
        "Dual-stack sockets are not supported on this platform. Recompile library with disabled IPv6 support."
        ;
      }
      else {
        local_b0 = 1;
        iVar2 = setsockopt(__fd,0,8,&local_b0,4);
        if (iVar2 < 0) {
          pcp_logger(PCP_LOGLVL_ERR,"%s","Unable to set IP_PKTINFO option for socket.");
        }
        iVar2 = setsockopt(__fd,0x29,0x31,&local_b0,4);
        if (iVar2 < 0) {
          pcVar5 = "Unable to set IPV6_RECVPKTINFO option for socket.";
        }
        else {
          sVar4 = 0x10;
          if (local_a8.sa_family == 10) {
            sVar4 = 0x1c;
          }
          iVar2 = bind(__fd,&local_a8,sVar4);
          if (iVar2 != -1) {
            return __fd;
          }
          piVar3 = __errno_location();
          while (*piVar3 == 0x62) {
            uVar1 = (local_a8.sa_data._0_2_ << 8 | (ushort)local_a8.sa_data._0_2_ >> 8) + 1;
            local_a8.sa_data._0_2_ = uVar1 * 0x100 | uVar1 >> 8;
            sVar4 = 0x1c;
            if (local_a8.sa_family != 10) {
              sVar4 = 0x10;
            }
            iVar2 = bind(__fd,&local_a8,sVar4);
            if (iVar2 != -1) {
              return __fd;
            }
          }
          pcVar5 = "bind error";
        }
      }
    }
    else {
      pcVar5 = "Unable to set nonblocking mode for socket.";
    }
    pcp_logger(PCP_LOGLVL_ERR,"%s",pcVar5);
    close(__fd);
  }
  return -1;
}

Assistant:

static PCP_SOCKET pcp_socket_create_impl(int domain, int type, int protocol) {
#ifdef PCP_SOCKET_IS_VOIDPTR
    return PCP_INVALID_SOCKET;
#else
    PCP_SOCKET s;
    uint32_t flg;
    unsigned long iMode = 1;
    struct sockaddr_storage sas;
    struct sockaddr_in *sin = (struct sockaddr_in *)&sas;
    struct sockaddr_in6 *sin6 = (struct sockaddr_in6 *)&sas;

    OSDEP(iMode);
    OSDEP(flg);

    memset(&sas, 0, sizeof(sas));
    sas.ss_family = domain;
    if (domain == AF_INET) {
        sin->sin_port = htons(5350);
        SET_SA_LEN(sin, sizeof(struct sockaddr_in));
    } else if (domain == AF_INET6) {
        sin6->sin6_port = htons(5350);
        SET_SA_LEN(sin6, sizeof(struct sockaddr_in6));
    } else {
        PCP_LOG(PCP_LOGLVL_ERR, "Unsupported socket domain:%d", domain);
    }

    s = (PCP_SOCKET)socket(domain, type, protocol);
    if (s == PCP_INVALID_SOCKET)
        return PCP_INVALID_SOCKET;

#ifdef WIN32
    if (ioctlsocket(s, FIONBIO, &iMode)) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Unable to set nonblocking mode for socket.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#else  // WIN32
    flg = fcntl(s, F_GETFL, 0);
    if (fcntl(s, F_SETFL, flg | O_NONBLOCK)) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Unable to set nonblocking mode for socket.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#endif //! WIN32
#ifdef PCP_USE_IPV6_SOCKET
    flg = 0;
    if (PCP_SOCKET_ERROR ==
        setsockopt(s, IPPROTO_IPV6, IPV6_V6ONLY, (char *)&flg, sizeof(flg))) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Dual-stack sockets are not supported on this platform. "
                "Recompile library with disabled IPv6 support.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#endif // PCP_USE_IPV6_SOCKET
#if defined(IP_PKTINFO) || defined(IPV6_RECVPKTINFO) || defined(IPV6_PKTINFO)
    {
        int optval = 1;
#if defined WIN32 && defined IPV6_PKTINFO
        if (setsockopt(s, IPPROTO_IPV6, IPV6_PKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IPV6_PKTINFO option for socket.");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
#endif // WIN32 && IPV6_PKTINFO
#ifdef IP_PKTINFO
        if (setsockopt(s, IPPROTO_IP, IP_PKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IP_PKTINFO option for socket.");
        }
#endif // IP_PKTINFO
#ifdef IPV6_RECVPKTINFO
        if (setsockopt(s, IPPROTO_IPV6, IPV6_RECVPKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IPV6_RECVPKTINFO option for socket.");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
#endif // IPV6_RECVPKTINFO
    }
#endif // IP_PKTINFO && IPV6_RECVPKTINFO
    while (bind(s, (struct sockaddr *)&sas, SA_LEN((struct sockaddr *)&sas)) ==
           PCP_SOCKET_ERROR) {
        if (pcp_get_error() == PCP_ERR_ADDRINUSE) {
            if (sas.ss_family == AF_INET) {
                sin->sin_port = htons(ntohs(sin->sin_port) + 1);
            } else {
                sin6->sin6_port = htons(ntohs(sin6->sin6_port) + 1);
            }
        } else {
            PCP_LOG(PCP_LOGLVL_ERR, "%s", "bind error");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
    }
    PCP_LOG(PCP_LOGLVL_DEBUG, "%s: return %d", __FUNCTION__, s);
    return s;
#endif
}